

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O1

void FAudioFXReverb_Free(void *fapo)

{
  code *pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pcVar1 = *(code **)((long)fapo + 0xd0);
  (*pcVar1)(*(undefined8 *)((long)fapo + 0x108));
  (*pcVar1)(*(undefined8 *)((long)fapo + 0x128));
  if (0 < *(int *)((long)fapo + 0x140)) {
    lVar5 = (long)fapo + 0x180;
    lVar2 = (long)fapo + 0x540;
    lVar3 = 0;
    do {
      (*pcVar1)(*(undefined8 *)((long)fapo + lVar3 * 0x4b0 + 0x160));
      lVar4 = 0;
      do {
        (*pcVar1)(*(undefined8 *)(lVar5 + lVar4));
        lVar4 = lVar4 + 0x78;
      } while (lVar4 != 0x3c0);
      lVar4 = 0;
      do {
        (*pcVar1)(*(undefined8 *)(lVar2 + lVar4));
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0xa0);
      lVar3 = lVar3 + 1;
      lVar5 = lVar5 + 0x4b0;
      lVar2 = lVar2 + 0x4b0;
    } while (lVar3 < *(int *)((long)fapo + 0x140));
  }
  (**(code **)((long)fapo + 0xd0))(*(undefined8 *)((long)fapo + 0xa0));
  (**(code **)((long)fapo + 0xd0))();
  return;
}

Assistant:

void FAudioFXReverb_Free(void* fapo)
{
	FAudioFXReverb *reverb = (FAudioFXReverb*) fapo;
	DspReverb_Destroy(&reverb->reverb, reverb->base.pFree);
	reverb->base.pFree(reverb->base.m_pParameterBlocks);
	reverb->base.pFree(fapo);
}